

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O1

int __thiscall
vkt::pipeline::TestTextureCubeArray::copy
          (TestTextureCubeArray *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int size;
  int arraySize;
  TestTextureCubeArray *this_00;
  TextureFormat local_28;
  
  local_28 = (TextureFormat)src;
  this_00 = (TestTextureCubeArray *)operator_new(0x70);
  size = *(int *)(dst + 0x58);
  arraySize = (**(code **)(*(long *)dst + 0x20))(dst);
  TestTextureCubeArray(this_00,&local_28,size,arraySize);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)this_00;
  TestTexture::copyToTexture((TestTexture *)dst,(TestTexture *)this_00);
  return (int)this;
}

Assistant:

de::MovePtr<TestTexture> TestTextureCubeArray::copy(const tcu::TextureFormat format) const
{
	DE_ASSERT(!isCompressed());

	de::MovePtr<TestTexture>	texture	(new TestTextureCubeArray(format, m_texture.getSize(), getArraySize()));

	copyToTexture(*texture);

	return texture;
}